

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ForeverStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeverStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ForeverStatementSyntax *this_00;
  
  this_00 = (ForeverStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForeverStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ForeverStatementSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar2 = args_2->kind;
  uVar3 = args_2->field_0x2;
  NVar4.raw = (args_2->numFlags).raw;
  uVar5 = args_2->rawLen;
  pIVar1 = args_2->info;
  syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,ForeverStatement,*args,args_1);
  (this_00->foreverKeyword).kind = TVar2;
  (this_00->foreverKeyword).field_0x2 = uVar3;
  (this_00->foreverKeyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (this_00->foreverKeyword).rawLen = uVar5;
  (this_00->foreverKeyword).info = pIVar1;
  (this_00->statement).ptr = args_3;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }